

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

hts_itr_t *
hts_itr_querys(hts_idx_t *idx,char *reg,hts_name2id_f getid,void *hdr,hts_itr_query_func *itr_query,
              hts_readrec_func *readrec)

{
  long lVar1;
  char *pcVar2;
  hts_readrec_func *phVar3;
  hts_readrec_func *phVar4;
  hts_itr_query_func *phVar5;
  hts_name2id_f p_Var6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t __n;
  void *pvVar8;
  undefined8 uStack_70;
  char acStack_68 [8];
  char *local_60;
  char *tmp;
  char *q;
  uint local_48;
  int end;
  int beg;
  int tid;
  hts_readrec_func *readrec_local;
  hts_itr_query_func *itr_query_local;
  void *hdr_local;
  hts_name2id_f getid_local;
  char *reg_local;
  hts_idx_t *idx_local;
  
  uStack_70 = 0x112380;
  _beg = readrec;
  readrec_local = (hts_readrec_func *)itr_query;
  itr_query_local = (hts_itr_query_func *)hdr;
  hdr_local = getid;
  getid_local = (hts_name2id_f)reg;
  reg_local = (char *)idx;
  iVar7 = strcmp(reg,".");
  if (iVar7 == 0) {
    uStack_70 = 0x11239c;
    iVar7 = (*readrec_local)((BGZF *)reg_local,(void *)0xfffffffd,(void *)0x0,(int *)0x0,(int *)_beg
                             ,(int *)readrec);
    idx_local = (hts_idx_t *)CONCAT44(extraout_var,iVar7);
  }
  else {
    uStack_70 = 0x1123b5;
    iVar7 = strcmp((char *)getid_local,"*");
    if (iVar7 == 0) {
      uStack_70 = 0x112489;
      iVar7 = (*readrec_local)((BGZF *)reg_local,(void *)0xfffffffe,(void *)0x0,(int *)0x0,
                               (int *)_beg,(int *)readrec);
      idx_local = (hts_idx_t *)CONCAT44(extraout_var_01,iVar7);
    }
    else {
      uStack_70 = 0x1123cf;
      tmp = hts_parse_reg((char *)getid_local,(int *)&local_48,(int *)((long)&q + 4));
      p_Var6 = getid_local;
      lVar1 = -((ulong)(tmp + (0x10 - (long)getid_local)) & 0xfffffffffffffff0);
      __n = (long)tmp - (long)getid_local;
      local_60 = acStack_68 + lVar1;
      *(undefined8 *)((long)&uStack_70 + lVar1) = 0x11240b;
      strncpy(acStack_68 + lVar1,(char *)p_Var6,__n);
      pvVar8 = hdr_local;
      phVar5 = itr_query_local;
      pcVar2 = local_60;
      local_60[(long)tmp - (long)getid_local] = '\0';
      *(undefined8 *)((long)&uStack_70 + lVar1) = 0x11242c;
      end = (*(code *)pvVar8)(phVar5,pcVar2);
      p_Var6 = getid_local;
      pvVar8 = hdr_local;
      phVar5 = itr_query_local;
      if (end < 0) {
        *(undefined8 *)((long)&uStack_70 + lVar1) = 0x112442;
        end = (*(code *)pvVar8)(phVar5,p_Var6);
      }
      pcVar2 = reg_local;
      phVar4 = readrec_local;
      phVar3 = _beg;
      if (end < 0) {
        idx_local = (hts_idx_t *)0x0;
      }
      else {
        pvVar8 = (void *)(ulong)(uint)end;
        *(undefined8 *)((long)&uStack_70 + lVar1) = 0x11246c;
        iVar7 = (*phVar4)((BGZF *)pcVar2,pvVar8,(void *)(ulong)local_48,(int *)(ulong)q._4_4_,
                          (int *)phVar3,(int *)readrec);
        idx_local = (hts_idx_t *)CONCAT44(extraout_var_00,iVar7);
      }
    }
  }
  return (hts_itr_t *)idx_local;
}

Assistant:

hts_itr_t *hts_itr_querys(const hts_idx_t *idx, const char *reg, hts_name2id_f getid, void *hdr, hts_itr_query_func *itr_query, hts_readrec_func *readrec)
{
    int tid, beg, end;
    char *q, *tmp;
    if (strcmp(reg, ".") == 0)
        return itr_query(idx, HTS_IDX_START, 0, 0, readrec);
    else if (strcmp(reg, "*") != 0) {
        q = (char*)hts_parse_reg(reg, &beg, &end);
        tmp = (char*)alloca(q - reg + 1);
        strncpy(tmp, reg, q - reg);
        tmp[q - reg] = 0;
        if ((tid = getid(hdr, tmp)) < 0)
            tid = getid(hdr, reg);
        if (tid < 0) return 0;
        return itr_query(idx, tid, beg, end, readrec);
    } else return itr_query(idx, HTS_IDX_NOCOOR, 0, 0, readrec);
}